

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifinp(bifcxdef *ctx,int argc)

{
  runcxdef *ctx_00;
  int iVar1;
  size_t len;
  char inbuf [128];
  char acStack_98 [136];
  
  outflushn(0);
  outreset();
  iVar1 = getstring((char *)0x0,acStack_98,0x80);
  ctx_00 = ctx->bifcxrun;
  if (iVar1 == 0) {
    len = strlen(acStack_98);
    runpushcstr(ctx_00,acStack_98,len,0);
    return;
  }
  ctx_00->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3f9);
}

Assistant:

void bifinp(bifcxdef *ctx, int argc)
{
    char inbuf[128];

    /* check for proper argument count */
    bifcntargs(ctx, 0, argc);

    /* make sure the prompt is displayed */
    tioflushn(ctx->bifcxtio, 0);

     /* reset count of lines since the last keyboard input */
    tioreset(ctx->bifcxtio);

    /* read a line of text */
    if (tiogets(ctx->bifcxtio, (char *)0, inbuf, (int)sizeof(inbuf)))
        runsig(ctx->bifcxrun, ERR_RUNQUIT);

    /* push the string, converting escapes */
    runpushcstr(ctx->bifcxrun, inbuf, strlen(inbuf), 0);
}